

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  tuple;
  value_type *in_stack_fffffffffffffe68;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe70;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffe78;
  anon_class_48_3_3bdf3dc2 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe80;
  function<void_()> *this_01;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe90;
  CQueue *in_stack_fffffffffffffe98;
  CLogger *in_stack_fffffffffffffeb8;
  vector<char_data_*,_std::allocator<char_data_*>_> *in_stack_fffffffffffffec0;
  undefined5 in_stack_fffffffffffffec8;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  string local_120 [48];
  int local_f0;
  string local_e8 [32];
  function<void_()> local_c8;
  undefined1 local_a8 [96];
  undefined8 local_48;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_48 = 2;
    fmt._M_str = (char *)in_stack_fffffffffffffeb8;
    fmt._M_len = (size_t)in_RDI;
    CLogger::Warn<unsigned_long>((CLogger *)in_RDX,fmt,(unsigned_long *)in_RCX);
  }
  std::
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::tuple<true,_true>(in_stack_fffffffffffffe70,(char_data **)in_stack_fffffffffffffe68,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x697215)
  ;
  GetCharacterData<char_data*&,std::__cxx11::string&>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  local_f0 = local_c;
  std::__cxx11::string::string(local_e8,(string *)in_RDX);
  this_01 = &local_c8;
  std::__cxx11::string::string((string *)this_01,in_RCX);
  __f = (anon_class_48_3_3bdf3dc2 *)local_a8;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            (in_stack_fffffffffffffec0,
             (vector<char_data_*,_std::allocator<char_data_*>_> *)in_stack_fffffffffffffeb8);
  this_00 = (queueEntry_t *)(local_a8 + 0x18);
  std::__cxx11::string::string(local_120,in_stack_00000008);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&)::_lambda()_1_,void>
            (this_01,__f);
  uVar3 = 0;
  uVar2 = 0;
  uVar1 = 0;
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,
             in_stack_fffffffffffffe68);
  queueEntry_t::~queueEntry_t(this_00);
  AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&)
  ::{lambda()#1}::~AddToQueue((anon_class_48_3_3bdf3dc2 *)0x69732a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_01,(char *)__f);
  fmt_00._M_str._0_5_ = in_stack_fffffffffffffec8;
  fmt_00._M_len = (size_t)in_stack_fffffffffffffec0;
  fmt_00._M_str._5_1_ = uVar1;
  fmt_00._M_str._6_1_ = uVar2;
  fmt_00._M_str._7_1_ = uVar3;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            (in_stack_fffffffffffffeb8,fmt_00,in_RDI,in_RDX,(int *)in_RCX);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)this_01);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}